

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::DOMLSSerializerImpl::isNamespaceBindingActive
          (DOMLSSerializerImpl *this,XMLCh *prefix,XMLCh *uri)

{
  byte bVar1;
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  RefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_> *str1;
  XMLSize_t getAt;
  
  str1 = this->fNamespaceStack;
  getAt = (str1->
          super_BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>).
          fCurCount;
  do {
    getAt = getAt - 1;
    bVar1 = (byte)str1;
    if (getAt == 0xffffffffffffffff) goto LAB_0028d94d;
    this_00 = BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>::
              elementAt(&this->fNamespaceStack->
                         super_BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>
                        ,getAt);
    str1 = (RefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_> *)
           RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get(this_00,prefix);
  } while (str1 == (RefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_> *
                   )0x0);
  bVar1 = XMLString::equals((XMLCh *)str1,uri);
LAB_0028d94d:
  return (bool)(getAt != 0xffffffffffffffff & bVar1);
}

Assistant:

bool DOMLSSerializerImpl::isNamespaceBindingActive(const XMLCh* prefix, const XMLCh* uri) const
{
    for(XMLSize_t i=fNamespaceStack->size();i>0;i--)
    {
        RefHashTableOf<XMLCh>* curNamespaceMap=fNamespaceStack->elementAt(i-1);
        const XMLCh* thisUri=curNamespaceMap->get((void*)prefix);
        // if the prefix has been declared, check if it binds to the correct namespace, otherwise, reports it isn't bound
        if(thisUri)
            return XMLString::equals(thisUri,uri);
    }
    return false;
}